

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxpmhandler.cpp
# Opt level: O2

bool read_xpm_string(QByteArray *buf,QIODevice *d,char **source,int *index,QByteArray *state)

{
  char cVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  long lVar7;
  int iVar8;
  long in_FS_OFFSET;
  char buf_1 [2048];
  QArrayDataPointer<char> local_858;
  char local_838 [2048];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (source == (char **)0x0) {
    QByteArray::operator=(buf,"");
    iVar8 = 0;
    bVar6 = false;
    while( true ) {
      do {
        lVar7 = (state->d).size;
        if (lVar7 == iVar8 || lVar7 == 0) {
          memset(local_838,0xaa,0x800);
          lVar7 = QIODevice::read((char *)d,(longlong)local_838);
          if (lVar7 < 1) {
            bVar6 = false;
            goto LAB_002999ee;
          }
          QByteArray::QByteArray((QByteArray *)&local_858,local_838,(long)(int)lVar7);
          pDVar3 = (state->d).d;
          pcVar4 = (state->d).ptr;
          (state->d).d = local_858.d;
          (state->d).ptr = local_858.ptr;
          qVar2 = (state->d).size;
          (state->d).size = local_858.size;
          local_858.d = pDVar3;
          local_858.ptr = pcVar4;
          local_858.size = qVar2;
          QArrayDataPointer<char>::~QArrayDataPointer(&local_858);
          iVar8 = 0;
        }
        lVar7 = (long)iVar8;
        iVar8 = iVar8 + 1;
        cVar1 = (state->d).ptr[lVar7];
        bVar5 = !bVar6;
        bVar6 = cVar1 == '\"';
      } while (bVar5);
      if (cVar1 == '\"') break;
      QByteArray::append((char)buf);
      bVar6 = true;
    }
    QByteArray::remove((longlong)state,0);
  }
  else {
    iVar8 = *index;
    *index = iVar8 + 1;
    QByteArray::operator=(buf,source[iVar8]);
  }
  bVar6 = true;
LAB_002999ee:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

static bool read_xpm_string(QByteArray &buf, QIODevice *d, const char * const *source, int &index,
                            QByteArray &state)
{
    if (source) {
        buf = source[index++];
        return true;
    }

    buf = "";
    bool gotQuote = false;
    int offset = 0;
    forever {
        if (offset == state.size() || state.isEmpty()) {
            char buf[2048];
            qint64 bytesRead = d->read(buf, sizeof(buf));
            if (bytesRead <= 0)
                return false;
            state = QByteArray(buf, int(bytesRead));
            offset = 0;
        }

        if (!gotQuote) {
            if (state.at(offset++) == '"')
                gotQuote = true;
        } else {
            char c = state.at(offset++);
            if (c == '"')
                break;
            buf += c;
        }
    }
    state.remove(0, offset);
    return true;
}